

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPersistentManifold.h
# Opt level: O2

bool __thiscall
cbtPersistentManifoldSortPredicate::operator()
          (cbtPersistentManifoldSortPredicate *this,cbtPersistentManifold *lhs,
          cbtPersistentManifold *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lhs->m_body0->m_islandTag1;
  if (iVar1 < 0) {
    iVar1 = lhs->m_body1->m_islandTag1;
  }
  iVar2 = rhs->m_body0->m_islandTag1;
  if (iVar2 < 0) {
    iVar2 = rhs->m_body1->m_islandTag1;
  }
  return iVar1 < iVar2;
}

Assistant:

SIMD_FORCE_INLINE const cbtCollisionObject* getBody0() const { return m_body0; }